

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall
CVmObjByteArray::getp_copy_from(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  ulong uVar2;
  CVmObjByteArray *pCVar3;
  unsigned_long uVar4;
  CVmObjByteArray *pCVar5;
  unsigned_long uVar6;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjByteArray *src_arr;
  vm_obj_id_t src_arr_id;
  unsigned_long cnt;
  unsigned_long src_idx;
  unsigned_long dst_idx;
  CVmNativeCodeDesc *in_stack_ffffffffffffff78;
  uint *in_stack_ffffffffffffff80;
  vm_val_t *in_stack_ffffffffffffff88;
  ulong cnt_00;
  CVmObjByteArray *pCVar7;
  undefined4 in_stack_ffffffffffffffc8;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  CVmObjByteArray *in_stack_ffffffffffffffd0;
  
  if ((getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_copy_from::desc,4);
    __cxa_guard_release(&getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (iVar1 == 0) {
    CVmBif::pop_obj_val();
    iVar1 = is_byte_array(0);
    if (iVar1 == 0) {
      err_throw(0);
    }
    vm_objp(0);
    iVar1 = CVmBif::pop_int_val();
    uVar2 = (ulong)iVar1;
    if (uVar2 == 0) {
      cnt_00 = 1;
    }
    else {
      cnt_00 = uVar2;
      uVar4 = get_element_count((CVmObjByteArray *)0x2c3379);
      if (uVar4 + 1 < uVar2) {
        uVar4 = get_element_count((CVmObjByteArray *)0x2c3394);
        cnt_00 = uVar4 + 1;
      }
    }
    iVar1 = CVmBif::pop_int_val();
    pCVar3 = (CVmObjByteArray *)(long)iVar1;
    if (pCVar3 == (CVmObjByteArray *)0x0) {
      pCVar7 = (CVmObjByteArray *)0x1;
    }
    else {
      pCVar7 = pCVar3;
      uVar4 = get_element_count((CVmObjByteArray *)0x2c33d2);
      if ((CVmObjByteArray *)(uVar4 + 1) < pCVar3) {
        uVar4 = get_element_count((CVmObjByteArray *)0x2c33ed);
        pCVar7 = (CVmObjByteArray *)(uVar4 + 1);
      }
    }
    iVar1 = CVmBif::pop_int_val();
    uVar4 = (unsigned_long)iVar1;
    pCVar3 = pCVar7;
    pCVar5 = (CVmObjByteArray *)get_element_count((CVmObjByteArray *)0x2c3418);
    if (pCVar5 < pCVar7) {
      uVar4 = 0;
    }
    else {
      uVar2 = (long)pCVar3 + (uVar4 - 1);
      uVar6 = get_element_count((CVmObjByteArray *)0x2c344c);
      if (uVar6 < uVar2) {
        uVar4 = get_element_count((CVmObjByteArray *)0x2c3462);
        uVar4 = (uVar4 + 1) - (long)pCVar3;
      }
    }
    save_undo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(unsigned_long)pCVar3,cnt_00);
    copy_from(in_stack_ffffffffffffffd0,
              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),pCVar3,cnt_00,uVar4);
    vm_val_t::set_obj(in_RDX,in_ESI);
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_copy_from(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(4);
    unsigned long dst_idx;
    unsigned long src_idx;
    unsigned long cnt;
    vm_obj_id_t src_arr_id;
    CVmObjByteArray *src_arr;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the source array */
    src_arr_id = CVmBif::pop_obj_val(vmg0_);

    /* make sure it is indeed an array */
    if (!is_byte_array(vmg_ src_arr_id))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* we know it's the right type, so cast it */
    src_arr = (CVmObjByteArray *)vm_objp(vmg_ src_arr_id);

    /* get the starting source index */
    src_idx = CVmBif::pop_int_val(vmg0_);

    /* force it to be in range */
    if (src_idx < 1)
        src_idx = 1;
    else if (src_idx > src_arr->get_element_count() + 1)
        src_idx = src_arr->get_element_count() + 1;

    /* get the destination index */
    dst_idx = CVmBif::pop_int_val(vmg0_);

    /* force it to be within range */
    if (dst_idx < 1)
        dst_idx = 1;
    else if (dst_idx > get_element_count() + 1)
        dst_idx = get_element_count() + 1;

    /* get the count */
    cnt = CVmBif::pop_int_val(vmg0_);

    /* limit the copying to the available destination space */
    if (dst_idx > get_element_count())
        cnt = 0;
    else if (dst_idx + cnt - 1 > get_element_count())
        cnt = get_element_count() + 1 - dst_idx;

    /* save undo for the change */
    save_undo(vmg_ self, dst_idx, cnt);

    /* copy the data from the source array into our array */
    copy_from(dst_idx, src_arr, src_idx, cnt);

    /* the result is 'self' */
    retval->set_obj(self);

    /* handled */
    return TRUE;
}